

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_json.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_3a3674::Handlers::addChoices
          (Handlers *this,char **choices,bool required,param_handler_t *fn)

{
  JSONHandler *this_00;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_60;
  long local_50;
  undefined8 uStack_48;
  char **local_40;
  undefined1 uStack_38;
  undefined7 uStack_37;
  Handlers *local_30;
  
  this_00 = this->jh;
  std::function<void_(const_char_*)>::function((function<void_(const_char_*)> *)&local_60,fn);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_40 = choices;
  uStack_38 = required;
  local_30 = this;
  local_88._M_unused._M_object = operator_new(0x38);
  *(undefined8 *)local_88._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x18) = uStack_48;
  if (local_50 != 0) {
    *(void **)local_88._M_unused._0_8_ = local_60._M_unused._M_object;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_60._8_8_;
    *(long *)((long)local_88._M_unused._0_8_ + 0x10) = local_50;
    local_50 = 0;
    uStack_48 = 0;
  }
  *(Handlers **)((long)local_88._M_unused._0_8_ + 0x30) = local_30;
  *(char ***)((long)local_88._M_unused._0_8_ + 0x20) = local_40;
  *(ulong *)((long)local_88._M_unused._0_8_ + 0x28) = CONCAT71(uStack_37,uStack_38);
  pcStack_70 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:148:9)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob_json.cc:148:9)>
             ::_M_manager;
  JSONHandler::addStringHandler(this_00,(string_handler_t *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_60);
  return;
}

Assistant:

void
Handlers::addChoices(char const** choices, bool required, param_handler_t fn)
{
    jh->addStringHandler(
        [fn, choices, required, this](std::string const& path, std::string const& parameter) {
            char const* p = parameter.c_str();
            bool matches = false;
            if ((!required) && (parameter.empty())) {
                matches = true;
            }
            if (!matches) {
                for (char const** i = choices; *i; ++i) {
                    if (strcmp(*i, p) == 0) {
                        QTC::TC("qpdf", "QPDFJob json choice match");
                        matches = true;
                        break;
                    }
                }
            }
            if (!matches) {
                QTC::TC("qpdf", "QPDFJob json choice mismatch");
                std::ostringstream msg;
                msg << path + ": unexpected value; expected one of ";
                bool first = true;
                for (char const** i = choices; *i; ++i) {
                    if (first) {
                        first = false;
                    } else {
                        msg << ", ";
                    }
                    msg << *i;
                }
                usage(msg.str());
            }
            fn(parameter.c_str());
        });
}